

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::BranchPattern::fix_repeating_arguments(BranchPattern *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pvVar2;
  pointer pvVar3;
  pointer psVar4;
  bool bVar5;
  Kind KVar6;
  size_type sVar7;
  long *plVar8;
  string *str;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  __it;
  const_iterator cVar9;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  undefined1 auVar12 [8];
  pointer *ppvVar13;
  long lVar14;
  value *this_01;
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  undefined1 auStack_108 [8];
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  groups;
  undefined1 auStack_b8 [8];
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  either;
  type child;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_80 [8];
  type children;
  undefined1 auStack_58 [8];
  PatternList group;
  
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_140,&this->fChildren);
  auStack_b8 = (undefined1  [8])0x0;
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  either.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_108 = (undefined1  [8])0x0;
  groups.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  groups.
  super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  ::
  emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
            ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
              *)auStack_108,&local_140);
  do {
    if (auStack_108 ==
        (undefined1  [8])
        groups.
        super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                 *)auStack_108);
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector(&local_140);
      pvVar3 = either.
               super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar12 = auStack_b8;
      do {
        if (auVar12 == (undefined1  [8])pvVar3) {
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
          ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                     *)auStack_b8);
          return;
        }
        std::
        _Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
        ::
        _Hashtable<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                  ((_Hashtable<std::shared_ptr<docopt::Pattern>,std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<docopt::Pattern>>,docopt::PatternHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,false>>
                    *)auStack_108,
                   (((pointer)auVar12)->
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (((pointer)auVar12)->
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,0,local_80,auStack_58,
                   &either.
                    super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppvVar13 = &groups.
                    super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
LAB_0019a8f3:
        ppvVar13 = (pointer *)*ppvVar13;
        if (ppvVar13 != (pointer *)0x0) {
          sVar7 = std::
                  _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                  ::count((_Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                           *)auStack_108,(key_type *)(ppvVar13 + 1));
          if (((sVar7 != 1) && (pvVar2 = ppvVar13[1], pvVar2 != (pointer)0x0)) &&
             (plVar8 = (long *)__dynamic_cast(pvVar2,&Pattern::typeinfo,&LeafPattern::typeinfo),
             plVar8 != (long *)0x0)) {
            lVar11 = __dynamic_cast(plVar8,&LeafPattern::typeinfo,&Command::typeinfo);
            if (lVar11 != 0) {
LAB_0019a959:
              local_80._0_4_ = 2;
              children.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              value::operator=((value *)(plVar8 + 5),(value *)local_80);
              value::~value((value *)local_80);
              goto LAB_0019a8f3;
            }
            lVar11 = __dynamic_cast(plVar8,&LeafPattern::typeinfo,&Argument::typeinfo);
            if (lVar11 == 0) {
              if ((undefined **)*plVar8 != &PTR_flat_001c2420) goto LAB_0019a8f3;
              if ((int)plVar8[0x12] == 0) goto LAB_0019a959;
            }
            group.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            auStack_58 = (undefined1  [8])0x0;
            group.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            this_01 = (value *)(plVar8 + 5);
            KVar6 = *(Kind *)(plVar8 + 5);
            if (KVar6 == String) {
              str = value::asString_abi_cxx11_(this_01);
              anon_unknown.dwarf_1336db::split
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_80,str,0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_move_assign((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)auStack_58,(value *)local_80);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_80);
              KVar6 = this_01->kind;
            }
            if (KVar6 != StringList) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_128,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_58);
              local_80._0_4_ = 4;
              children.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              children.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (pointer)local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              children.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)local_128.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_128.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              value::operator=(this_01,(value *)local_80);
              value::~value((value *)local_80);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_128);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_58);
          }
          goto LAB_0019a8f3;
        }
        std::
        _Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
        ::~_Hashtable((_Hashtable<std::shared_ptr<docopt::Pattern>,_std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<docopt::Pattern>_>,_docopt::PatternHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_false>_>
                       *)auStack_108);
        auVar12 = (undefined1  [8])((long)auVar12 + 0x18);
      } while( true );
    }
    local_80 = (undefined1  [8])
               (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)auStack_108)->_M_impl).super__Vector_impl_data._M_start;
    children.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)auStack_108)->_M_impl).super__Vector_impl_data._M_finish;
    children.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)auStack_108)->_M_impl).super__Vector_impl_data._M_end_of_storage;
    (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       *)auStack_108)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
    (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       *)auStack_108)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
    (((_Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
       *)auStack_108)->_M_impl).super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __it._M_current = (shared_ptr<docopt::Pattern> *)auStack_108;
    std::
    vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
    ::erase((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)auStack_108,(const_iterator)auStack_108);
    psVar4 = children.
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)children.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)local_80;
    auVar12 = local_80;
    for (lVar14 = lVar11 >> 6; cVar9._M_current = (shared_ptr<docopt::Pattern> *)auVar12, 0 < lVar14
        ; lVar14 = lVar14 + -1) {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)auVar12,__it);
      if (bVar5) goto LAB_0019a673;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)auVar12 + 0x10),__it);
      cVar9._M_current = (shared_ptr<docopt::Pattern> *)((long)auVar12 + 0x10);
      if (bVar5) goto LAB_0019a673;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)auVar12 + 0x20),__it);
      cVar9._M_current = (shared_ptr<docopt::Pattern> *)((long)auVar12 + 0x20);
      if (bVar5) goto LAB_0019a673;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)((long)auVar12 + 0x30),__it);
      cVar9._M_current = (shared_ptr<docopt::Pattern> *)((long)auVar12 + 0x30);
      if (bVar5) goto LAB_0019a673;
      auVar12 = (undefined1  [8])((long)auVar12 + 0x40);
      lVar11 = lVar11 + -0x40;
    }
    lVar11 = lVar11 >> 4;
    if (lVar11 == 1) {
LAB_0019a85f:
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
              ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                            *)auVar12,__it);
      cVar9._M_current = (shared_ptr<docopt::Pattern> *)auVar12;
      if (!bVar5) {
        cVar9._M_current = psVar4;
      }
LAB_0019a673:
      if (cVar9._M_current == psVar4) goto LAB_0019a754;
      either.
      super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((cVar9._M_current)->
                    super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      child.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           ((cVar9._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      ((cVar9._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((cVar9._M_current)->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      erase((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_80,cVar9);
      pvVar3 = either.
               super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (either.
          super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
LAB_0019a7d2:
        lVar11 = __dynamic_cast(pvVar3,&Pattern::typeinfo,&typeinfo,0);
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)auStack_58,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)(lVar11 + 8));
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_58,
                   (const_iterator)
                   group.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                    )local_80,
                   (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                    )children.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        std::
        vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
        ::
        emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                    *)auStack_108,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)auStack_58);
LAB_0019a812:
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)auStack_58);
      }
      else {
        lVar11 = __dynamic_cast(either.
                                super__Vector_base<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &Pattern::typeinfo,&Either::typeinfo,0);
        if (lVar11 == 0) {
          lVar11 = __dynamic_cast(pvVar3,&Pattern::typeinfo,&OneOrMore::typeinfo,0);
          if (lVar11 == 0) goto LAB_0019a7d2;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)auStack_58,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)(lVar11 + 8));
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)auStack_58,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     *(shared_ptr<docopt::Pattern> **)(lVar11 + 8),
                     *(shared_ptr<docopt::Pattern> **)(lVar11 + 0x10));
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)auStack_58,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )local_80,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )children.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      *)auStack_108,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)auStack_58);
          goto LAB_0019a812;
        }
        p_Var1 = *(__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> **)(lVar11 + 0x10);
        for (p_Var10 = *(__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> **)(lVar11 + 8);
            p_Var10 != p_Var1; p_Var10 = p_Var10 + 1) {
          this_00 = &child.super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount;
          std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> *)this_00,p_Var10);
          __l._M_len = 1;
          __l._M_array = (iterator)this_00;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)auStack_58,__l,
                   (allocator_type *)
                   ((long)&group.
                           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)auStack_58,
                     (const_iterator)
                     group.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )local_80,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      )children.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                      *)auStack_108,
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)auStack_58);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)auStack_58);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child);
    }
    else {
      if (lVar11 == 2) {
LAB_0019a84b:
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
                ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                              *)auVar12,__it);
        cVar9._M_current = (shared_ptr<docopt::Pattern> *)auVar12;
        if (!bVar5) {
          auVar12 = (undefined1  [8])((long)auVar12 + 0x10);
          goto LAB_0019a85f;
        }
        goto LAB_0019a673;
      }
      if (lVar11 == 3) {
        bVar5 = __gnu_cxx::__ops::
                _Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::{lambda(std::shared_ptr<docopt::Pattern>const&)#1}>
                ::operator()((_Iter_pred<docopt::transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::_lambda(std::shared_ptr<docopt::Pattern>const&)_1_>
                              *)auVar12,__it);
        if (!bVar5) {
          auVar12 = (undefined1  [8])((long)auVar12 + 0x10);
          goto LAB_0019a84b;
        }
        goto LAB_0019a673;
      }
LAB_0019a754:
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
      ::
      emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
                  *)auStack_b8,
                 (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  *)local_80);
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)local_80);
  } while( true );
}

Assistant:

inline void BranchPattern::fix_repeating_arguments()
	{
		std::vector<PatternList> either = transform(children());
		for(auto const& group : either) {
			// use multiset to help identify duplicate entries
			std::unordered_multiset<std::shared_ptr<Pattern>, PatternHasher> group_set {group.begin(), group.end()};
			for(auto const& e : group_set) {
				if (group_set.count(e) == 1)
					continue;

				LeafPattern* leaf = dynamic_cast<LeafPattern*>(e.get());
				if (!leaf) continue;

				bool ensureList = false;
				bool ensureInt = false;

				if (dynamic_cast<Command*>(leaf)) {
					ensureInt = true;
				} else if (dynamic_cast<Argument*>(leaf)) {
					ensureList = true;
				} else if (Option* o = dynamic_cast<Option*>(leaf)) {
					if (o->argCount()) {
						ensureList = true;
					} else {
						ensureInt = true;
					}
				}

				if (ensureList) {
					std::vector<std::string> newValue;
					if (leaf->getValue().isString()) {
						newValue = split(leaf->getValue().asString());
					}
					if (!leaf->getValue().isStringList()) {
						leaf->setValue(value{newValue});
					}
				} else if (ensureInt) {
					leaf->setValue(value{0});
				}
			}
		}
	}